

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall qpdf::BaseHandle::disconnect(BaseHandle *this,bool only_direct)

{
  bool bVar1;
  qpdf_object_type_e qVar2;
  QPDF_Array *this_00;
  pointer pSVar3;
  reference ppVar4;
  BaseHandle *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *this_02;
  pointer pMVar5;
  element_type *peVar6;
  QPDFObjGen local_a0;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_98;
  unique_ptr<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_> *local_88;
  QPDF_Stream *s;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *iter;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *__range2;
  QPDFObjectHandle *oh;
  iterator __end3_1;
  iterator __begin3_1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range3_1;
  pair<const_int,_QPDFObjectHandle> *item;
  iterator __end3;
  iterator __begin3;
  map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
  *__range3;
  QPDF_Array *a;
  bool only_direct_local;
  BaseHandle *this_local;
  
  if ((!only_direct) || (bVar1 = indirect(this), !bVar1)) {
    qVar2 = raw_type_code(this);
    switch(qVar2) {
    case ot_uninitialized:
      return;
    default:
      break;
    case ot_array:
      peVar6 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      this_00 = std::
                get<QPDF_Array,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                          (&peVar6->value);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this_00);
      if (bVar1) {
        pSVar3 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                 operator->(&this_00->sp);
        __end3 = std::
                 map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                 ::begin(&pSVar3->elements);
        item = (pair<const_int,_QPDFObjectHandle> *)
               std::
               map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
               ::end(&pSVar3->elements);
        while (bVar1 = std::operator!=(&__end3,(_Self *)&item), bVar1) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator*
                             (&__end3);
          disconnect(&(ppVar4->second).super_BaseHandle,true);
          std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator++(&__end3);
        }
      }
      else {
        __end3_1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                             (&this_00->elements);
        oh = (QPDFObjectHandle *)
             std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                       (&this_00->elements);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                   *)&oh), bVar1) {
          this_01 = &__gnu_cxx::
                     __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                     ::operator*(&__end3_1)->super_BaseHandle;
          disconnect(this_01,true);
          __gnu_cxx::
          __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
          ::operator++(&__end3_1);
        }
      }
      break;
    case ot_dictionary:
      peVar6 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      this_02 = &std::
                 get<QPDF_Dictionary,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                           (&peVar6->value)->items;
      __end2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               ::begin(this_02);
      iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                ::end(this_02);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&iter), bVar1) {
        s = (QPDF_Stream *)
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
            ::operator*(&__end2);
        disconnect(&(((reference)s)->second).super_BaseHandle,true);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
        ::operator++(&__end2);
      }
      break;
    case ot_stream:
      peVar6 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      local_88 = &std::
                  get<QPDF_Stream,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                            (&peVar6->value)->m;
      std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr(&local_98,(nullptr_t)0x0);
      pMVar5 = std::unique_ptr<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_>::
               operator->(local_88);
      std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::operator=
                (&pMVar5->stream_provider,&local_98);
      std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_98);
      pMVar5 = std::unique_ptr<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_>::
               operator->(local_88);
      disconnect(&(pMVar5->stream_dict).super_BaseHandle,true);
    }
    peVar6 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    peVar6->qpdf = (QPDF *)0x0;
    memset(&local_a0,0,8);
    QPDFObjGen::QPDFObjGen(&local_a0);
    peVar6 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this);
    peVar6->og = local_a0;
  }
  return;
}

Assistant:

void
BaseHandle::disconnect(bool only_direct)
{
    // QPDF::~QPDF() calls disconnect for indirect objects, so we don't do that here.
    if (only_direct && indirect()) {
        return;
    }

    switch (raw_type_code()) {
    case ::ot_array:
        {
            auto& a = std::get<QPDF_Array>(obj->value);
            if (a.sp) {
                for (auto& item: a.sp->elements) {
                    item.second.disconnect();
                }
            } else {
                for (auto& oh: a.elements) {
                    oh.disconnect();
                }
            }
        }
        break;
    case ::ot_dictionary:
        for (auto& iter: std::get<QPDF_Dictionary>(obj->value).items) {
            iter.second.disconnect();
        }
        break;
    case ::ot_stream:
        {
            auto& s = std::get<QPDF_Stream>(obj->value);
            s.m->stream_provider = nullptr;
            s.m->stream_dict.disconnect();
        }
        break;
    case ::ot_uninitialized:
        return;
    default:
        break;
    }
    obj->qpdf = nullptr;
    obj->og = QPDFObjGen();
}